

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cpp
# Opt level: O1

void __thiscall
duration_as_seconds_all_spaced_Test::~duration_as_seconds_all_spaced_Test
          (duration_as_seconds_all_spaced_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(duration, as_seconds_all_spaced) {
	EXPECT_EQ(duration_from_string(" 1234 "sv).duration.count(), 1234);
	EXPECT_EQ(duration_from_string(" 0 s "sv).duration.count(), 0);
	EXPECT_EQ(duration_from_string(" 1 s "sv).duration.count(), 1);
	EXPECT_EQ(duration_from_string(" 5000 ms "sv).duration.count(), 5);
	EXPECT_EQ(duration_from_string(" 5000000 us "sv).duration.count(), 5);
	EXPECT_EQ(duration_from_string(" 5000000000 ns "sv).duration.count(), 5);
	EXPECT_EQ(duration_from_string(" 1 h "sv).duration.count(), 3600);
	EXPECT_EQ(duration_from_string(" 1 hr "sv).duration.count(), 3600);
	EXPECT_EQ(duration_from_string(" 1 hour "sv).duration.count(), 3600);
	EXPECT_EQ(duration_from_string(" 1 hours "sv).duration.count(), 3600);
	EXPECT_EQ(duration_from_string(" 1 hrs "sv).duration.count(), 3600);
	EXPECT_EQ(duration_from_string(" 1 d "sv).duration.count(), 86400);
	EXPECT_EQ(duration_from_string(" 1 day "sv).duration.count(), 86400);
	EXPECT_EQ(duration_from_string(" 1 days "sv).duration.count(), 86400);
	EXPECT_EQ(duration_from_string(" 1 w "sv).duration.count(), 604800);
	EXPECT_EQ(duration_from_string(" 1 week "sv).duration.count(), 604800);
	EXPECT_EQ(duration_from_string(" 1 weeks "sv).duration.count(), 604800);
	EXPECT_EQ(duration_from_string(" 1 mo "sv).duration.count(), 2629746);
	EXPECT_EQ(duration_from_string(" 1 mon "sv).duration.count(), 2629746);
	EXPECT_EQ(duration_from_string(" 1 month "sv).duration.count(), 2629746);
	EXPECT_EQ(duration_from_string(" 1 months "sv).duration.count(), 2629746);
	EXPECT_EQ(duration_from_string(" 1 y "sv).duration.count(), 31556952);
	EXPECT_EQ(duration_from_string(" 1 year "sv).duration.count(), 31556952);
	EXPECT_EQ(duration_from_string(" 1 years "sv).duration.count(), 31556952);
}